

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O2

void __thiscall ncnn::Convolution::~Convolution(Convolution *this)

{
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__Convolution_0013ad00;
  if (this->quantize != (Layer *)0x0) {
    (*this->quantize->_vptr_Layer[1])();
  }
  if (this->dequantize != (Layer *)0x0) {
    (*this->dequantize->_vptr_Layer[1])();
  }
  Mat::~Mat(&this->bias_data);
  Mat::~Mat(&this->weight_data);
  Layer::~Layer(&this->super_Layer);
  return;
}

Assistant:

Convolution::~Convolution()
{
    delete quantize;
    delete dequantize;
}